

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * declaration(C_Parser *parser,C_Token **rest,C_Token *tok,C_Type *basety,VarAttr *attr)

{
  C_Token *tok_00;
  _Bool _Var1;
  undefined2 uVar2;
  C_Token **ppCVar3;
  C_Token **parser_00;
  _Bool _Var4;
  C_Type *ty_00;
  C_Obj *pCVar5;
  char *pcVar6;
  C_VarScope *pCVar7;
  C_Node *pCVar8;
  C_Node *pCVar9;
  C_Node *pCVar10;
  int iVar11;
  C_Node *node;
  C_Node *expr_1;
  C_Obj *var;
  C_Node *expr;
  C_Token *tok_1;
  C_Obj *var_2;
  C_Obj *var_1;
  C_Type *ty;
  C_Node *pCStack_160;
  int i;
  C_Node *cur;
  C_Node head;
  VarAttr *attr_local;
  C_Type *basety_local;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  basety_local = (C_Type *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  memset(&cur,0,0x120);
  pCStack_160 = (C_Node *)&cur;
  ty._4_4_ = 0;
  while( true ) {
    _Var4 = C_equal((C_Token *)basety_local,";");
    if (((_Var4 ^ 0xffU) & 1) == 0) {
      pCVar10 = new_node((C_Parser *)rest_local,ND_BLOCK,(C_Token *)basety_local);
      pCVar10->body = (C_Node *)head._0_8_;
      _Var4 = basety_local->is_unsigned;
      _Var1 = basety_local->is_atomic;
      uVar2 = *(undefined2 *)&basety_local->field_0xe;
      tok_local->kind = basety_local->align;
      tok_local->field_0x4 = _Var4;
      tok_local->field_0x5 = _Var1;
      *(undefined2 *)&tok_local->field_0x6 = uVar2;
      return pCVar10;
    }
    iVar11 = ty._4_4_ + 1;
    if (0 < ty._4_4_) {
      basety_local = (C_Type *)C_skip((C_Parser *)rest_local,(C_Token *)basety_local,",");
    }
    ty_00 = declarator((C_Parser *)rest_local,(C_Token **)&basety_local,(C_Token *)basety_local,
                       basety);
    ppCVar3 = rest_local;
    if (ty_00->kind == TY_VOID) break;
    if (ty_00->name == (C_Token *)0x0) {
      C_error_tok((C_Parser *)rest_local,ty_00->name_pos,"variable name omitted");
    }
    ty._4_4_ = iVar11;
    if ((attr == (VarAttr *)0x0) || ((attr->is_static & 1U) == 0)) {
      pCVar10 = compute_vla_size((C_Parser *)rest_local,ty_00,(C_Token *)basety_local);
      pCVar10 = new_unary((C_Parser *)ppCVar3,ND_EXPR_STMT,pCVar10,(C_Token *)basety_local);
      pCStack_160->next = pCVar10;
      ppCVar3 = rest_local;
      if (ty_00->kind == TY_VLA) {
        _Var4 = C_equal((C_Token *)basety_local,"=");
        ppCVar3 = rest_local;
        if (_Var4) {
          C_error_tok((C_Parser *)rest_local,(C_Token *)basety_local,
                      "variable-sized object may not be initialized");
        }
        pcVar6 = get_ident((C_Parser *)rest_local,ty_00->name);
        pCVar5 = new_lvar((C_Parser *)ppCVar3,pcVar6,ty_00);
        ppCVar3 = rest_local;
        tok_00 = ty_00->name;
        pCVar8 = new_vla_ptr((C_Parser *)rest_local,pCVar5,tok_00);
        parser_00 = rest_local;
        pCVar9 = new_var_node((C_Parser *)rest_local,ty_00->vla_size,tok_00);
        pCVar9 = new_alloca((C_Parser *)parser_00,pCVar9);
        pCVar8 = new_binary((C_Parser *)ppCVar3,ND_ASSIGN,pCVar8,pCVar9,tok_00);
        pCStack_160 = new_unary((C_Parser *)rest_local,ND_EXPR_STMT,pCVar8,tok_00);
        pCVar10->next = pCStack_160;
      }
      else {
        pcVar6 = get_ident((C_Parser *)rest_local,ty_00->name);
        pCVar5 = new_lvar((C_Parser *)ppCVar3,pcVar6,ty_00);
        if ((attr != (VarAttr *)0x0) && (attr->align != 0)) {
          pCVar5->align = attr->align;
        }
        _Var4 = C_equal((C_Token *)basety_local,"=");
        pCStack_160 = pCVar10;
        if (_Var4) {
          pCVar8 = lvar_initializer((C_Parser *)rest_local,(C_Token **)&basety_local,
                                    *(C_Token **)&basety_local->align,pCVar5);
          pCStack_160 = new_unary((C_Parser *)rest_local,ND_EXPR_STMT,pCVar8,(C_Token *)basety_local
                                 );
          pCVar10->next = pCStack_160;
        }
        if (pCVar5->ty->size < 0) {
          C_error_tok((C_Parser *)rest_local,ty_00->name,"variable has incomplete type");
        }
        if (pCVar5->ty->kind == TY_VOID) {
          C_error_tok((C_Parser *)rest_local,ty_00->name,"variable declared void");
        }
      }
    }
    else {
      pCVar5 = new_anon_gvar((C_Parser *)rest_local,ty_00);
      ppCVar3 = rest_local;
      pcVar6 = get_ident((C_Parser *)rest_local,ty_00->name);
      pCVar7 = push_scope((C_Parser *)ppCVar3,pcVar6);
      pCVar7->var = pCVar5;
      _Var4 = C_equal((C_Token *)basety_local,"=");
      if (_Var4) {
        gvar_initializer((C_Parser *)rest_local,(C_Token **)&basety_local,
                         *(C_Token **)&basety_local->align,pCVar5);
      }
    }
  }
  C_error_tok((C_Parser *)rest_local,(C_Token *)basety_local,"variable declared void");
}

Assistant:

static C_Node *declaration(C_Parser *parser, C_Token **rest, C_Token *tok, C_Type *basety, VarAttr *attr) {
  C_Node head = {0};
  C_Node *cur = &head;
  int i = 0;

  while (!C_equal(tok, ";")) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    C_Type *ty = declarator(parser, &tok, tok, basety);
    if (ty->kind == TY_VOID)
      C_error_tok(parser, tok, "variable declared void");
    if (!ty->name)
      C_error_tok(parser, ty->name_pos, "variable name omitted");

    if (attr && attr->is_static) {
      // static local variable
      C_Obj *var = new_anon_gvar(parser, ty);
      push_scope(parser, get_ident(parser, ty->name))->var = var;
      if (C_equal(tok, "="))
        gvar_initializer(parser, &tok, tok->next, var);
      continue;
    }

    // Generate code for computing a VLA size. We need to do this
    // even if ty is not VLA because ty may be a pointer to VLA
    // (e.g. int (*foo)[n][m] where n and m are variables.)
    cur = cur->next = new_unary(parser, ND_EXPR_STMT, compute_vla_size(parser, ty, tok), tok);

    if (ty->kind == TY_VLA) {
      if (C_equal(tok, "="))
        C_error_tok(parser, tok, "variable-sized object may not be initialized");

      // Variable length arrays (VLAs) are translated to alloca() calls.
      // For example, `int x[n+2]` is translated to `tmp = n + 2,
      // x = alloca(tmp)`.
      C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
      C_Token *tok = ty->name;
      C_Node *expr = new_binary(parser, ND_ASSIGN, new_vla_ptr(parser, var, tok),
                              new_alloca(parser, new_var_node(parser, ty->vla_size, tok)),
                              tok);

      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
      continue;
    }

    C_Obj *var = new_lvar(parser, get_ident(parser, ty->name), ty);
    if (attr && attr->align)
      var->align = attr->align;

    if (C_equal(tok, "=")) {
      C_Node *expr = lvar_initializer(parser, &tok, tok->next, var);
      cur = cur->next = new_unary(parser, ND_EXPR_STMT, expr, tok);
    }

    if (var->ty->size < 0)
      C_error_tok(parser, ty->name, "variable has incomplete type");
    if (var->ty->kind == TY_VOID)
      C_error_tok(parser, ty->name, "variable declared void");
  }

  C_Node *node = new_node(parser, ND_BLOCK, tok);
  node->body = head.next;
  *rest = tok->next;
  return node;
}